

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents)

{
  undefined8 uVar1;
  bool bVar2;
  int value;
  string *value_00;
  EnumValueOptions *options;
  SubstituteArg local_438;
  SubstituteArg local_408;
  SubstituteArg local_3d8;
  SubstituteArg local_3a8;
  SubstituteArg local_378;
  SubstituteArg local_348;
  SubstituteArg local_318;
  SubstituteArg local_2e8;
  SubstituteArg local_2b8;
  SubstituteArg local_288;
  undefined1 local_258 [8];
  string formatted_options;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string prefix;
  string *contents_local;
  int depth_local;
  EnumValueDescriptor *this_local;
  
  prefix.field_2._8_8_ = contents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(long)(depth * 2),' ',&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar1 = prefix.field_2._8_8_;
  strings::internal::SubstituteArg::SubstituteArg(&local_88,(string *)local_40);
  value_00 = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_b8,value_00);
  value = number(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_e8,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_118);
  strings::internal::SubstituteArg::SubstituteArg(&local_148);
  strings::internal::SubstituteArg::SubstituteArg(&local_178);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
  strings::internal::SubstituteArg::SubstituteArg(&local_208);
  strings::internal::SubstituteArg::SubstituteArg
            ((SubstituteArg *)((long)&formatted_options.field_2 + 8));
  strings::SubstituteAndAppend
            ((string *)uVar1,"$0$1 = $2",&local_88,&local_b8,&local_e8,&local_118,&local_148,
             &local_178,&local_1a8,&local_1d8,&local_208,
             (SubstituteArg *)((long)&formatted_options.field_2 + 8));
  std::__cxx11::string::string((string *)local_258);
  options = EnumValueDescriptor::options(this);
  bVar2 = anon_unknown_1::FormatBracketedOptions(depth,&options->super_Message,(string *)local_258);
  uVar1 = prefix.field_2._8_8_;
  if (bVar2) {
    strings::internal::SubstituteArg::SubstituteArg(&local_288,(string *)local_258);
    strings::internal::SubstituteArg::SubstituteArg(&local_2b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_318);
    strings::internal::SubstituteArg::SubstituteArg(&local_348);
    strings::internal::SubstituteArg::SubstituteArg(&local_378);
    strings::internal::SubstituteArg::SubstituteArg(&local_3a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_3d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_408);
    strings::internal::SubstituteArg::SubstituteArg(&local_438);
    strings::SubstituteAndAppend
              ((string *)uVar1," [$0]",&local_288,&local_2b8,&local_2e8,&local_318,&local_348,
               &local_378,&local_3a8,&local_3d8,&local_408,&local_438);
  }
  std::__cxx11::string::append((char *)prefix.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  strings::SubstituteAndAppend(contents, "$0$1 = $2",
                               prefix, name(), number());

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), &formatted_options)) {
    strings::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");
}